

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReporterTest.cpp
# Opt level: O2

void __thiscall
TEST_CodeMemoryReportFormatter_VariableFromFileLineInfoAlreadyExists_Test::
~TEST_CodeMemoryReportFormatter_VariableFromFileLineInfoAlreadyExists_Test
          (TEST_CodeMemoryReportFormatter_VariableFromFileLineInfoAlreadyExists_Test *this)

{
  TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter::
  ~TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter
            (&this->super_TEST_GROUP_CppUTestGroupCodeMemoryReportFormatter);
  operator_delete(this,0x70);
  return;
}

Assistant:

TEST(CodeMemoryReportFormatter, VariableFromFileLineInfoAlreadyExists)
{
    for(int i = 1; i < 100; i++) {
         formatter->report_alloc_memory(testResult, newArrayAllocator, 10, memory01, "file", 8);
    }
    formatter->report_alloc_memory(testResult, newArrayAllocator, 10, memory01, "file", 8);
    testOutput.flush();
    formatter->report_free_memory(testResult, newArrayAllocator, memory01, "boo", 8);
    TESTOUTPUT_CONTAINS("delete [] ; /* using delete [] at boo:8 */");
}